

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

Wlc_Ntk_t * Wla_ManCreateAbs(Wla_Man_t *pWla)

{
  Vec_Int_t *pVVar1;
  Wlc_Ntk_t *pWVar2;
  Wlc_Ntk_t *pAbs;
  Wla_Man_t *pWla_local;
  
  if (pWla->vBlacks == (Vec_Int_t *)0x0) {
    pVVar1 = Wlc_NtkGetBlacks(pWla->p,pWla->pPars);
    pWla->vBlacks = pVVar1;
    pVVar1 = Vec_IntDup(pWla->vBlacks);
    pWla->vSignals = pVVar1;
  }
  else {
    Wlc_NtkUpdateBlacks(pWla->p,pWla->pPars,&pWla->vBlacks,pWla->vUnmark,pWla->vSignals);
  }
  pWVar2 = Wlc_NtkAbs2(pWla->p,pWla->vBlacks,(Vec_Int_t **)0x0);
  return pWVar2;
}

Assistant:

Wlc_Ntk_t * Wla_ManCreateAbs( Wla_Man_t * pWla )
{
    Wlc_Ntk_t * pAbs;

    // get abstracted GIA and the set of pseudo-PIs (vBlacks)
    if ( pWla->vBlacks == NULL )
    {
        pWla->vBlacks = Wlc_NtkGetBlacks( pWla->p, pWla->pPars );
        pWla->vSignals = Vec_IntDup( pWla->vBlacks );
    }
    else
    {
        Wlc_NtkUpdateBlacks( pWla->p, pWla->pPars, &pWla->vBlacks, pWla->vUnmark, pWla->vSignals );
    }
    pAbs = Wlc_NtkAbs2( pWla->p, pWla->vBlacks, NULL );

    return pAbs;
}